

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall Parser_nonXmlString_Test::~Parser_nonXmlString_Test(Parser_nonXmlString_Test *this)

{
  Parser_nonXmlString_Test *this_local;
  
  ~Parser_nonXmlString_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Parser, nonXmlString)
{
    const std::string in = "Not an xml string.";
    const std::vector<std::string> expectedIssues = {
        "LibXml2 error: Start tag expected, '<' not found.",
        "Could not get a valid XML root node from the provided input.",
    };

    libcellml::ParserPtr p = libcellml::Parser::create();
    p->parseModel(in);
    EXPECT_EQ_ISSUES(expectedIssues, p);
}